

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_dropout_qcoeff(MACROBLOCK *mb,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,
                       int qindex)

{
  byte in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined1 in_R8B;
  int in_R9D;
  int unaff_retaddr;
  int dropout_num_after;
  int dropout_num_before;
  int multiplier;
  int base_size;
  int tx_height;
  int tx_width;
  undefined2 in_stack_ffffffffffffffec;
  
  if ((in_R9D < 0x81) && (0xf < in_R9D)) {
    av1_dropout_qcoeff_num
              ((MACROBLOCK *)CONCAT44(in_ESI,in_EDX),
               CONCAT13(in_CL,CONCAT12(in_R8B,in_stack_ffffffffffffffec)),in_R9D,
               (TX_SIZE)((uint)tx_size_wide[in_CL] >> 0x18),
               (TX_TYPE)((uint)tx_size_wide[in_CL] >> 0x10),tx_size_high[in_CL],unaff_retaddr);
  }
  return;
}

Assistant:

void av1_dropout_qcoeff(MACROBLOCK *mb, int plane, int block, TX_SIZE tx_size,
                        TX_TYPE tx_type, int qindex) {
  const int tx_width = tx_size_wide[tx_size];
  const int tx_height = tx_size_high[tx_size];

  // Early return if `qindex` is out of range.
  if (qindex > DROPOUT_Q_MAX || qindex < DROPOUT_Q_MIN) {
    return;
  }

  // Compute number of zeros used for dropout judgement.
  const int base_size = AOMMAX(tx_width, tx_height);
  const int multiplier = CLIP(qindex / DROPOUT_MULTIPLIER_Q_BASE,
                              DROPOUT_MULTIPLIER_MIN, DROPOUT_MULTIPLIER_MAX);
  const int dropout_num_before =
      multiplier *
      CLIP(base_size, DROPOUT_BEFORE_BASE_MIN, DROPOUT_BEFORE_BASE_MAX);
  const int dropout_num_after =
      multiplier *
      CLIP(base_size, DROPOUT_AFTER_BASE_MIN, DROPOUT_AFTER_BASE_MAX);

  av1_dropout_qcoeff_num(mb, plane, block, tx_size, tx_type, dropout_num_before,
                         dropout_num_after);
}